

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O1

bool __thiscall QProcessPrivate::waitForFinished(QProcessPrivate *this,QDeadlineTimer *deadline)

{
  int iVar1;
  byte unaff_BPL;
  long in_FS_OFFSET;
  QString local_78;
  pollfd local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (pollfd)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_14f7919::QProcessPoller::QProcessPoller((QProcessPoller *)&local_58,this);
    iVar1 = qt_safe_poll(&local_58,4,*deadline);
    if (iVar1 < 0) {
      iVar1 = 2;
    }
    else if (iVar1 == 0) {
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
      setError(this,Timedout,&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar1 = 1;
      unaff_BPL = 0;
    }
    else {
      if ((-1 < local_58.fd) && (((ulong)local_58 & 0x3c000000000000) != 0)) {
        _q_canWrite(this);
      }
      if ((-1 < (int)puStack_50) && (((ulong)puStack_50 & 0x39000000000000) != 0)) {
        _q_canReadStandardOutput(this);
      }
      if ((-1 < (int)local_48) && (((ulong)local_48 & 0x39000000000000) != 0)) {
        _q_canReadStandardError(this);
      }
      if (this->processState != '\0') {
        iVar1 = 0;
        if (((int)puStack_40 < 0) || (((ulong)puStack_40 & 0x39000000000000) == 0))
        goto LAB_00433392;
        processFinished(this);
      }
      iVar1 = 1;
      unaff_BPL = 1;
    }
LAB_00433392:
    if (iVar1 != 0) {
      if (iVar1 != 1) {
        unaff_BPL = 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return (bool)(unaff_BPL & 1);
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

bool QProcessPrivate::waitForFinished(const QDeadlineTimer &deadline)
{
#if defined (QPROCESS_DEBUG)
    qDebug("QProcessPrivate::waitForFinished(%lld)", deadline.remainingTime());
#endif

    forever {
        QProcessPoller poller(*this);

        int ret = poller.poll(deadline);

        if (ret < 0) {
            break;
        }
        if (ret == 0) {
            setError(QProcess::Timedout);
            return false;
        }

        if (qt_pollfd_check(poller.stdinPipe(), POLLOUT))
            _q_canWrite();

        if (qt_pollfd_check(poller.stdoutPipe(), POLLIN))
            _q_canReadStandardOutput();

        if (qt_pollfd_check(poller.stderrPipe(), POLLIN))
            _q_canReadStandardError();

        // Signals triggered by I/O may have stopped this process:
        if (processState == QProcess::NotRunning)
            return true;

        if (qt_pollfd_check(poller.forkfd(), POLLIN)) {
            processFinished();
            return true;
        }
    }